

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_set_to_array(MTBDD set,uint32_t *arr)

{
  uint32_t uVar1;
  mtbddnode_t n_00;
  mtbddnode_t n;
  uint32_t *arr_local;
  MTBDD set_local;
  
  n = (mtbddnode_t)arr;
  arr_local = (uint32_t *)set;
  while (arr_local != (uint32_t *)0x8000000000000000) {
    n_00 = MTBDD_GETNODE((MTBDD)arr_local);
    uVar1 = mtbddnode_getvariable(n_00);
    *(uint32_t *)&n->a = uVar1;
    arr_local = (uint32_t *)mtbddnode_followhigh((MTBDD)arr_local,n_00);
    n = (mtbddnode_t)((long)&n->a + 4);
  }
  return;
}

Assistant:

void
mtbdd_set_to_array(MTBDD set, uint32_t *arr)
{
    while (set != mtbdd_true) {
        mtbddnode_t n = MTBDD_GETNODE(set);
        *arr++ = mtbddnode_getvariable(n);
        set = node_gethigh(set, n);
    }
}